

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  void *pvVar3;
  pointer pSVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  DebugFilters *pDVar8;
  double dVar9;
  string file;
  string report;
  MemoryMappedFile exeFile;
  DebugInfo info;
  undefined1 local_210 [32];
  string local_1f0;
  MemoryMappedFile local_1d0;
  DebugFilters local_1b0;
  long *local_178;
  void *local_170;
  long local_168 [2];
  long *local_158;
  void *local_150;
  long local_148 [2];
  DebugInfo local_138;
  
  local_1b0.name._M_dataplus._M_p = (pointer)&local_1b0.name.field_2;
  local_1b0.name._M_string_length = 0;
  local_1b0.name.field_2._M_local_buf[0] = '\0';
  local_1b0.minFunction = 0x200;
  local_1b0.minData = 0x400;
  local_1b0.minClass = 0x800;
  local_1b0.minFile = 0x800;
  local_1b0.minTemplate = 0x200;
  local_1b0.minTemplateCount = 3;
  local_210._0_8_ = local_210 + 0x10;
  local_210._8_8_ = (void *)0x0;
  local_210[0x10] = '\0';
  parg_init((parg_state *)&local_138);
  do {
    while (iVar6 = parg_getopt_long((parg_state *)&local_138,argc,argv,"an:m:f:d:c:F:t:T:h",
                                    (parg_option *)
                                    parse_cmdline(int,char_const**,DebugFilters&,std::__cxx11::string&)
                                    ::argsTable,(int *)0x0),
          pSVar4 = local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start, 0x53 < iVar6) {
      switch(iVar6) {
      case 0x61:
        local_1b0.minFunction = 0;
        local_1b0.minData = 0;
        local_1b0.minClass = 0;
        local_1b0.minFile = 0;
        local_1b0.minTemplate = 0;
        break;
      case 0x62:
      case 0x65:
      case 0x67:
      case 0x68:
      case 0x69:
      case 0x6a:
      case 0x6b:
      case 0x6c:
        goto switchD_001096a2_caseD_62;
      case 99:
        dVar9 = atof((char *)local_138.m_Symbols.
                             super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                             super__Vector_impl_data._M_start);
        local_1b0.minClass = (int)(dVar9 * 1024.0);
        break;
      case 100:
        dVar9 = atof((char *)local_138.m_Symbols.
                             super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                             super__Vector_impl_data._M_start);
        local_1b0.minData = (int)(dVar9 * 1024.0);
        break;
      case 0x66:
        dVar9 = atof((char *)local_138.m_Symbols.
                             super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                             super__Vector_impl_data._M_start);
        local_1b0.minFunction = (int)(dVar9 * 1024.0);
        break;
      case 0x6d:
        dVar9 = atof((char *)local_138.m_Symbols.
                             super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                             super__Vector_impl_data._M_start);
        local_1b0.minTemplate = (int)(dVar9 * 1024.0);
        local_1b0.minClass = local_1b0.minTemplate;
        local_1b0.minFile = local_1b0.minTemplate;
        local_1b0.minFunction = local_1b0.minTemplate;
        local_1b0.minData = local_1b0.minTemplate;
        break;
      case 0x6e:
        pDVar8 = &local_1b0;
LAB_0010973b:
        pcVar2 = (char *)(pDVar8->name)._M_string_length;
        strlen((char *)local_138.m_Symbols.
                       super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                       super__Vector_impl_data._M_start);
        std::__cxx11::string::_M_replace((ulong)pDVar8,0,pcVar2,(ulong)pSVar4);
        break;
      default:
        if (iVar6 == 0x54) {
          local_1b0.minTemplateCount =
               atoi((char *)local_138.m_Symbols.
                            super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                            super__Vector_impl_data._M_start);
        }
        else {
          if (iVar6 != 0x74) goto switchD_001096a2_caseD_62;
          dVar9 = atof((char *)local_138.m_Symbols.
                               super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                               super__Vector_impl_data._M_start);
          local_1b0.minTemplate = (int)(dVar9 * 1024.0);
        }
      }
    }
    if (iVar6 < 0x3f) {
      pDVar8 = (DebugFilters *)local_210;
      if (iVar6 == 1) goto LAB_0010973b;
      if ((iVar6 != -1) || ((void *)local_210._8_8_ == (void *)0x0)) goto switchD_001096a2_caseD_62;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Symbols.super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Namespaces.super__Vector_base<NamespaceInfo,_std::allocator<NamespaceInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_ObjectFiles.super__Vector_base<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
      ;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_138.m_Templates.super__Vector_base<TemplateInfo,_std::allocator<TemplateInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_NamespaceToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_ObjectPathToIndex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_138.m_ObjectNameToFolders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      clock();
      paVar1 = &local_1f0.field_2;
      local_1f0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,".exe","");
      if ((ulong)local_210._8_8_ < local_1f0._M_string_length) goto LAB_0010997e;
      bVar5 = true;
      if ((void *)local_1f0._M_string_length == (void *)0x0) goto LAB_00109b88;
      lVar7 = 0;
      break;
    }
    if (iVar6 != 0x46) goto LAB_0010984e;
    dVar9 = atof((char *)local_138.m_Symbols.
                         super__Vector_base<SymbolInfo,_std::allocator<SymbolInfo>_>._M_impl.
                         super__Vector_impl_data._M_start);
    local_1b0.minFile = (int)(dVar9 * 1024.0);
  } while( true );
  while (lVar7 = lVar7 + -1, (void *)-lVar7 != (void *)local_1f0._M_string_length) {
    if (((char *)(local_1f0._M_string_length + (long)local_1f0._M_dataplus._M_p))[lVar7 + -1] !=
        ((char *)(local_210._8_8_ + local_210._0_8_))[lVar7 + -1]) goto LAB_0010997e;
  }
  goto LAB_00109b88;
LAB_0010984e:
  if (iVar6 == 0x3f) {
    main_cold_1();
  }
switchD_001096a2_caseD_62:
  main_cold_5();
  iVar6 = 0;
  goto LAB_0010987e;
LAB_0010997e:
  local_1d0._0_8_ = &local_1d0.fileSize;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,".dll","");
  if ((ulong)local_210._8_8_ < local_1d0.baseAddress) {
LAB_001099b2:
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,".EXE","");
    if ((ulong)local_210._8_8_ < local_170) {
LAB_001099f0:
      local_158 = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,".DLL","");
      if ((ulong)local_210._8_8_ < local_150) {
        bVar5 = false;
      }
      else {
        bVar5 = true;
        if (local_150 != (void *)0x0) {
          lVar7 = -1;
          do {
            bVar5 = *(char *)((long)local_158 + (long)local_150 + lVar7) ==
                    ((char *)(local_210._8_8_ + local_210._0_8_))[lVar7];
            if (!bVar5) break;
            pvVar3 = (void *)-lVar7;
            lVar7 = lVar7 + -1;
          } while (pvVar3 != local_150);
        }
      }
      if (local_158 != local_148) {
        operator_delete(local_158,local_148[0] + 1);
      }
    }
    else {
      bVar5 = true;
      if (local_170 != (void *)0x0) {
        lVar7 = 0;
        do {
          if (*(char *)((long)local_170 + (long)local_178 + -1 + lVar7) !=
              ((char *)(local_210._8_8_ + local_210._0_8_))[lVar7 + -1]) goto LAB_001099f0;
          lVar7 = lVar7 + -1;
        } while ((void *)-lVar7 != local_170);
      }
    }
    if (local_178 != local_168) {
      operator_delete(local_178,local_168[0] + 1);
    }
  }
  else {
    bVar5 = true;
    if (local_1d0.baseAddress != (void *)0x0) {
      lVar7 = 0;
      do {
        if (*(char *)((long)local_1d0.baseAddress + local_1d0._0_8_ + lVar7 + -1) !=
            ((char *)(local_210._8_8_ + local_210._0_8_))[lVar7 + -1]) goto LAB_001099b2;
        lVar7 = lVar7 + -1;
      } while ((void *)-lVar7 != local_1d0.baseAddress);
    }
  }
  if ((size_t *)local_1d0._0_8_ != &local_1d0.fileSize) {
    operator_delete((void *)local_1d0._0_8_,local_1d0.fileSize + 1);
  }
LAB_00109b88:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    fprintf(_stderr,"Finding debug location for %s ...\n",local_210._0_8_);
    MemoryMappedFile::MemoryMappedFile(&local_1d0,(char *)local_210._0_8_);
    if (local_1d0.baseAddress != (void *)0x0) {
      PEGetPDBPath_abi_cxx11_(&local_1f0,local_1d0.baseAddress,local_1d0.fileSize);
      if ((void *)local_1f0._M_string_length != (void *)0x0) {
        std::__cxx11::string::_M_assign((string *)local_210);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      MemoryMappedFile::~MemoryMappedFile(&local_1d0);
      goto LAB_00109c39;
    }
    main_cold_4();
LAB_00109cd6:
    iVar6 = 1;
  }
  else {
LAB_00109c39:
    fprintf(_stderr,"Reading debug info for %s ...\n",local_210._0_8_);
    bVar5 = ReadDebugInfo((char *)local_210._0_8_,&local_138);
    if (!bVar5) {
      main_cold_2();
      goto LAB_00109cd6;
    }
    fwrite("\nProcessing info...\n",0x14,1,_stderr);
    DebugInfo::ComputeDerivedData(&local_138);
    fwrite("Generating report...\n",0x15,1,_stderr);
    DebugInfo::WriteReport_abi_cxx11_(&local_1f0,&local_138,&local_1b0);
    main_cold_3();
    iVar6 = 0;
  }
  std::vector<TemplateInfo,_std::allocator<TemplateInfo>_>::~vector(&local_138.m_Templates);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_138.m_ObjectNameToFolders._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_138.m_ObjectPathToIndex._M_t);
  std::vector<ObjectFileInfo,_std::allocator<ObjectFileInfo>_>::~vector(&local_138.m_ObjectFiles);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_138.m_NamespaceToIndex._M_t);
  std::vector<NamespaceInfo,_std::allocator<NamespaceInfo>_>::~vector(&local_138.m_Namespaces);
  if (local_138.m_Contribs.super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.m_Contribs.
                    super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.m_Contribs.
                          super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.m_Contribs.
                          super__Vector_base<ContribInfo,_std::allocator<ContribInfo>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<SymbolInfo,_std::allocator<SymbolInfo>_>::~vector(&local_138.m_Symbols);
LAB_0010987e:
  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
    operator_delete((void *)local_210._0_8_,CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0.name._M_dataplus._M_p != &local_1b0.name.field_2) {
    operator_delete(local_1b0.name._M_dataplus._M_p,
                    CONCAT71(local_1b0.name.field_2._M_allocated_capacity._1_7_,
                             local_1b0.name.field_2._M_local_buf[0]) + 1);
  }
  return iVar6;
}

Assistant:

int main(int argc, char * const * argv)
{
    DebugFilters filters;
    std::string file;
    if (!parse_cmdline(argc, argv, filters, file))
    {
        return 0;
    }

    DebugInfo info;

    clock_t time1 = clock();

    if (ends_with(file, ".exe") || ends_with(file, ".dll") || ends_with(file, ".EXE") || ends_with(file, ".DLL"))
    {
        fprintf(stderr, "Finding debug location for %s ...\n", file.c_str());
        MemoryMappedFile exeFile(file.c_str());
        if (exeFile.baseAddress == nullptr)
        {
            fprintf(stderr, "ERROR: failed to memory-map file '%s'\n", file.c_str());
            return 1;
        }
        std::string pdbPath = PEGetPDBPath(exeFile.baseAddress, exeFile.fileSize);
        if (!pdbPath.empty())
            file = pdbPath;
    }

    fprintf(stderr, "Reading debug info for %s ...\n", file.c_str());
    bool pdbok = ReadDebugInfo(file.c_str(), info);
    if (!pdbok)
    {
        fprintf(stderr, "ERROR reading file via PDB\n");
        return 1;
    }
    fprintf(stderr, "\nProcessing info...\n");
    info.ComputeDerivedData();

    fprintf(stderr, "Generating report...\n");
    std::string report = info.WriteReport(filters);

    clock_t time2 = clock();
    float secs = float(time2 - time1) / CLOCKS_PER_SEC;

    fprintf(stderr, "Printing...\n");
    puts(report.c_str());
    fprintf(stderr, "Done in %.2f seconds!\n", secs);


    return 0;
}